

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

char * effect_projection(effect *effect)

{
  int iVar1;
  int iVar2;
  char *__s2;
  int local_34;
  int i;
  char *subeffect_proj;
  effect *e;
  int num_subeffects;
  effect *effect_local;
  
  if ((effect->index == 1) || (effect->index == 0x6c)) {
    iVar1 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    if ((iVar1 < 1) || (effect->next == (effect *)0x0)) {
      effect_local = (effect *)0x31840d;
    }
    else {
      subeffect_proj = (char *)effect->next;
      effect_local = (effect *)effect_projection((effect *)subeffect_proj);
      local_34 = 0;
      for (; subeffect_proj != (char *)0x0 && local_34 < iVar1;
          subeffect_proj = *(char **)subeffect_proj) {
        __s2 = effect_projection((effect *)subeffect_proj);
        iVar2 = strcmp((char *)effect_local,__s2);
        if (iVar2 != 0) {
          effect_local = (effect *)0x31840d;
          return (char *)effect_local;
        }
        local_34 = local_34 + 1;
      }
    }
  }
  else if ((projections[effect->subtype].player_desc == (char *)0x0) ||
          ((3 < base_descs[effect->index].efinfo_flag - 0xcU &&
           (base_descs[effect->index].efinfo_flag != 0x12)))) {
    effect_local = (effect *)0x31840d;
  }
  else {
    effect_local = (effect *)projections[effect->subtype].player_desc;
  }
  return (char *)effect_local;
}

Assistant:

const char *effect_projection(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);
		struct effect *e;
		const char *subeffect_proj;

		// Check if all subeffects have the same projection, and if
		// not just give up on it
		if (num_subeffects <= 0 || !effect->next) {
			return "";
		}

		e = effect->next;
		subeffect_proj = effect_projection(e);
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (!streq(subeffect_proj, effect_projection(e))) {
				return "";
			}
			e = e->next;
		}

		return subeffect_proj;
	} else if (projections[effect->subtype].player_desc != NULL) {
		// Non-random effect, extract the projection if there is one
		switch (base_descs[effect->index].efinfo_flag) {
			case EFINFO_BALL:
			case EFINFO_BOLTD:
			case EFINFO_BREATH:
			case EFINFO_SHORT:
			case EFINFO_SPOT:
				return projections[effect->subtype].player_desc;
		}
	}

	return "";
}